

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

int __thiscall QProgressDialogPrivate::init(QProgressDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  int value;
  QProgressDialogPrivate *pQVar1;
  QWidget *parent;
  QLabel *this_00;
  QStyle *pQVar2;
  QTimer *this_01;
  long in_FS_OFFSET;
  int align;
  QProgressDialog *q;
  QProgressDialogPrivate *this_02;
  QLabel *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  QFlagsStorage<Qt::WindowType> f;
  Connection local_28;
  Connection local_20;
  QFlag local_14 [2];
  undefined1 local_c [4];
  long local_8;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QProgressDialogPrivate *)q_func(this);
  parent = (QWidget *)operator_new(0x28);
  this_02 = pQVar1;
  memset(local_c,0,4);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b05fb);
  QLabel::QLabel(in_stack_ffffffffffffff80,(QString *)parent,(QWidget *)this_02,(WindowFlags)f.i);
  this->label = (QLabel *)parent;
  this_00 = (QLabel *)operator_new(0x28);
  QProgressBar::QProgressBar((QProgressBar *)this_00,parent);
  this->bar = (QProgressBar *)this_00;
  QProgressBar::setRange((QProgressBar *)this_02,(int)((ulong)parent >> 0x20),(int)parent);
  pQVar2 = QWidget::style((QWidget *)ctx);
  value = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,10,0,pQVar1);
  QFlag::QFlag(local_14,value);
  QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
            ((QFlags<Qt::AlignmentFlag> *)ctx,(QFlag)(int)((ulong)this_02 >> 0x20));
  QLabel::setAlignment
            (this_00,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)this >> 0x20,0));
  QObject::connect((QObject *)&local_20,(char *)pQVar1,(QObject *)"2canceled()",(char *)pQVar1,
                   0xb32784);
  QMetaObject::Connection::~Connection(&local_20);
  this_01 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(this_01,(QObject *)pQVar1);
  this->forceTimer = this_01;
  QObject::connect((QObject *)&local_28,(char *)this->forceTimer,(QObject *)"2timeout()",
                   (char *)pQVar1,0xb32799);
  QMetaObject::Connection::~Connection(&local_28);
  if ((this->useDefaultCancelText & 1U) == 0) {
    QProgressDialog::setCancelButtonText((QProgressDialog *)this_02,(QString *)ctx);
  }
  else {
    retranslateStrings(this_02);
  }
  QElapsedTimer::start();
  QTimer::start(this->forceTimer,(this->showTime).__r);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialogPrivate::init(const QString &labelText, const QString &cancelText,
                                  int min, int max)
{
    Q_Q(QProgressDialog);
    label = new QLabel(labelText, q);
    bar = new QProgressBar(q);
    bar->setRange(min, max);
    int align = q->style()->styleHint(QStyle::SH_ProgressDialog_TextLabelAlignment, nullptr, q);
    label->setAlignment(Qt::Alignment(align));
    QObject::connect(q, SIGNAL(canceled()), q, SLOT(cancel()));
    forceTimer = new QTimer(q);
    QObject::connect(forceTimer, SIGNAL(timeout()), q, SLOT(forceShow()));
    if (useDefaultCancelText) {
        retranslateStrings();
    } else {
        q->setCancelButtonText(cancelText);
    }
    starttime.start();
    forceTimer->start(showTime);
}